

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Net *_net,size_t blob_count)

{
  Net *pNVar1;
  Allocator *pAVar2;
  Allocator *pAVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  ExtractorPrivate *pEVar39;
  
  this->_vptr_Extractor = (_func_int **)&PTR__Extractor_0059c448;
  pEVar39 = (ExtractorPrivate *)operator_new(0x60);
  ExtractorPrivate::ExtractorPrivate(pEVar39,_net);
  this->d = pEVar39;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(&pEVar39->blob_mats,blob_count);
  pEVar39 = this->d;
  pNVar1 = pEVar39->net;
  bVar4 = (pNVar1->opt).use_shader_pack8;
  bVar5 = (pNVar1->opt).use_subgroup_ops;
  bVar6 = (pNVar1->opt).use_reserved_0;
  iVar7 = (pNVar1->opt).num_threads;
  pAVar2 = (pNVar1->opt).blob_allocator;
  pAVar3 = (pNVar1->opt).workspace_allocator;
  iVar8 = (pNVar1->opt).openmp_blocktime;
  bVar9 = (pNVar1->opt).use_winograd_convolution;
  bVar10 = (pNVar1->opt).use_sgemm_convolution;
  bVar11 = (pNVar1->opt).use_int8_inference;
  bVar12 = (pNVar1->opt).use_vulkan_compute;
  bVar13 = (pNVar1->opt).use_bf16_storage;
  bVar14 = (pNVar1->opt).use_fp16_packed;
  bVar15 = (pNVar1->opt).use_fp16_storage;
  bVar16 = (pNVar1->opt).use_fp16_arithmetic;
  bVar17 = (pNVar1->opt).use_int8_packed;
  bVar18 = (pNVar1->opt).use_int8_storage;
  bVar19 = (pNVar1->opt).use_int8_arithmetic;
  bVar20 = (pNVar1->opt).use_packing_layout;
  iVar21 = (pNVar1->opt).vulkan_device_index;
  bVar22 = (pNVar1->opt).use_reserved_1;
  bVar23 = (pNVar1->opt).use_image_storage;
  bVar24 = (pNVar1->opt).use_tensor_storage;
  bVar25 = (pNVar1->opt).use_reserved_2;
  iVar26 = (pNVar1->opt).flush_denormals;
  bVar27 = (pNVar1->opt).use_local_pool_allocator;
  bVar28 = (pNVar1->opt).use_shader_local_memory;
  bVar29 = (pNVar1->opt).use_cooperative_matrix;
  bVar30 = (pNVar1->opt).use_winograd23_convolution;
  bVar31 = (pNVar1->opt).use_winograd43_convolution;
  bVar32 = (pNVar1->opt).use_winograd63_convolution;
  bVar33 = (pNVar1->opt).use_a53_a55_optimized_kernel;
  bVar34 = (pNVar1->opt).use_fp16_uniform;
  bVar35 = (pNVar1->opt).use_int8_uniform;
  bVar36 = (pNVar1->opt).use_reserved_9;
  bVar37 = (pNVar1->opt).use_reserved_10;
  bVar38 = (pNVar1->opt).use_reserved_11;
  (pEVar39->opt).lightmode = (pNVar1->opt).lightmode;
  (pEVar39->opt).use_shader_pack8 = bVar4;
  (pEVar39->opt).use_subgroup_ops = bVar5;
  (pEVar39->opt).use_reserved_0 = bVar6;
  (pEVar39->opt).num_threads = iVar7;
  (pEVar39->opt).blob_allocator = pAVar2;
  (pEVar39->opt).workspace_allocator = pAVar3;
  (pEVar39->opt).openmp_blocktime = iVar8;
  (pEVar39->opt).use_winograd_convolution = bVar9;
  (pEVar39->opt).use_sgemm_convolution = bVar10;
  (pEVar39->opt).use_int8_inference = bVar11;
  (pEVar39->opt).use_vulkan_compute = bVar12;
  (pEVar39->opt).use_bf16_storage = bVar13;
  (pEVar39->opt).use_fp16_packed = bVar14;
  (pEVar39->opt).use_fp16_storage = bVar15;
  (pEVar39->opt).use_fp16_arithmetic = bVar16;
  (pEVar39->opt).use_int8_packed = bVar17;
  (pEVar39->opt).use_int8_storage = bVar18;
  (pEVar39->opt).use_int8_arithmetic = bVar19;
  (pEVar39->opt).use_packing_layout = bVar20;
  (pEVar39->opt).vulkan_device_index = iVar21;
  (pEVar39->opt).use_reserved_1 = bVar22;
  (pEVar39->opt).use_image_storage = bVar23;
  (pEVar39->opt).use_tensor_storage = bVar24;
  (pEVar39->opt).use_reserved_2 = bVar25;
  (pEVar39->opt).flush_denormals = iVar26;
  (pEVar39->opt).use_local_pool_allocator = bVar27;
  (pEVar39->opt).use_shader_local_memory = bVar28;
  (pEVar39->opt).use_cooperative_matrix = bVar29;
  (pEVar39->opt).use_winograd23_convolution = bVar30;
  (pEVar39->opt).use_winograd43_convolution = bVar31;
  (pEVar39->opt).use_winograd63_convolution = bVar32;
  (pEVar39->opt).use_a53_a55_optimized_kernel = bVar33;
  (pEVar39->opt).use_fp16_uniform = bVar34;
  (pEVar39->opt).use_int8_uniform = bVar35;
  (pEVar39->opt).use_reserved_9 = bVar36;
  (pEVar39->opt).use_reserved_10 = bVar37;
  (pEVar39->opt).use_reserved_11 = bVar38;
  return;
}

Assistant:

Extractor::Extractor(const Net* _net, size_t blob_count)
    : d(new ExtractorPrivate(_net))
{
    d->blob_mats.resize(blob_count);
    d->opt = d->net->opt;

#if NCNN_VULKAN
    if (d->net->opt.use_vulkan_compute)
    {
        d->local_blob_vkallocator = 0;
        d->local_staging_vkallocator = 0;

        d->blob_mats_gpu.resize(blob_count);
        d->blob_mats_gpu_image.resize(blob_count);
    }
#endif // NCNN_VULKAN
}